

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.h
# Opt level: O2

void __thiscall
cmServerProtocol1::GeneratorInformation::~GeneratorInformation(GeneratorInformation *this)

{
  std::__cxx11::string::~string((string *)&this->BuildDirectory);
  std::__cxx11::string::~string((string *)&this->SourceDirectory);
  std::__cxx11::string::~string((string *)&this->Platform);
  std::__cxx11::string::~string((string *)&this->Toolset);
  std::__cxx11::string::~string((string *)&this->ExtraGeneratorName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

GeneratorInformation() = default;